

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O2

type __thiscall
chrono::ChClassRegistration<chrono::ChFunction_Recorder>::_create<chrono::ChFunction_Recorder>
          (ChClassRegistration<chrono::ChFunction_Recorder> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)::operator_new(0x28);
  puVar1 = puVar2 + 1;
  *puVar2 = &PTR__ChFunction_Recorder_01191980;
  puVar2[2] = puVar1;
  puVar2[1] = puVar1;
  puVar2[3] = 0;
  puVar2[4] = puVar1;
  return puVar2;
}

Assistant:

typename enable_if< std::is_default_constructible<Tc>::value, void* >::type
    _create() {
        return reinterpret_cast<void*>(new Tc);
    }